

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O2

UChar * u_strncat_63(UChar *dst,UChar *src,int32_t n)

{
  UChar UVar1;
  UChar *pUVar2;
  UChar *pUVar3;
  long lVar4;
  
  pUVar2 = dst;
  if (0 < n) {
    do {
      pUVar3 = pUVar2;
      pUVar2 = pUVar3 + 1;
    } while (*pUVar3 != L'\0');
    lVar4 = 0;
    do {
      UVar1 = src[lVar4];
      pUVar3[lVar4] = UVar1;
      if (UVar1 == L'\0') {
        return dst;
      }
      lVar4 = lVar4 + 1;
    } while (n != (int)lVar4);
    pUVar3[lVar4] = L'\0';
  }
  return dst;
}

Assistant:

U_CAPI UChar*  U_EXPORT2
u_strncat(UChar     *dst, 
     const UChar     *src, 
     int32_t     n ) 
{
    if(n > 0) {
        UChar *anchor = dst;            /* save a pointer to start of dst */

        while(*dst != 0) {              /* To end of first string          */
            ++dst;
        }
        while((*dst = *src) != 0) {     /* copy string 2 over              */
            ++dst;
            if(--n == 0) {
                *dst = 0;
                break;
            }
            ++src;
        }

        return anchor;
    } else {
        return dst;
    }
}